

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acesup.c
# Opt level: O1

Board * acesup_boardCreate(Card **cards,unsigned_long cardsCount)

{
  Board *board;
  Spot *pSVar1;
  uchar spotIndex;
  long lVar2;
  
  board = board_create();
  spotIndex = '\0';
  pSVar1 = spot_create(STOCK,'\0');
  board_spotAdd(board,pSVar1);
  pSVar1 = spot_create(FOUNDATION,'\0');
  board_spotAdd(board,pSVar1);
  do {
    pSVar1 = spot_create(TABLEAU,spotIndex);
    board_spotAdd(board,pSVar1);
    spotIndex = spotIndex + '\x01';
  } while (spotIndex != '\x04');
  lVar2 = 0;
  do {
    board_cardAdd(board,TABLEAU,(uchar)lVar2,cards[lVar2]);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  lVar2 = 4;
  do {
    board_cardAdd(board,STOCK,'\0',cards[lVar2]);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x34);
  return board;
}

Assistant:

Board * acesup_boardCreate(Card ** cards, unsigned long cardsCount)
{
	Board * board = board_create();
	unsigned char i;

	board_spotAdd(board, spot_create(STOCK, 0));
	board_spotAdd(board, spot_create(FOUNDATION, 0));

	for(i=0;i<4;i++)
	{
		board_spotAdd(board, spot_create(TABLEAU, i));
	}

	for(i=0;i<4;i++)
	{
		board_cardAdd(board, TABLEAU, i, cards[i]);
	}
	for(;i<52;i++)
	{
		board_cardAdd(board, STOCK, 0, cards[i]);
	}

	return board;
}